

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::Matcher<void_*>::Matcher(Matcher<void_*> *this,void *value)

{
  void *local_38;
  Matcher<void_*> local_30;
  void *local_18;
  void *value_local;
  Matcher<void_*> *this_local;
  
  local_18 = value;
  value_local = this;
  internal::MatcherBase<void_*>::MatcherBase(&this->super_MatcherBase<void_*>);
  (this->super_MatcherBase<void_*>)._vptr_MatcherBase = (_func_int **)&PTR__Matcher_001dc4e0;
  local_38 = (void *)Eq<void*>(local_18);
  internal::EqMatcher::operator_cast_to_Matcher(&local_30,(EqMatcher *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }